

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O2

SocketPeerInfo * sk_net_peer_info(Socket *sock)

{
  uint uVar1;
  _Bool _Var2;
  int iVar3;
  SocketPeerInfo *ptr;
  char *pcVar4;
  passwd *ppVar5;
  group *pgVar6;
  char *pcVar7;
  int gid;
  int uid;
  int pid;
  socklen_t addrlen;
  sockaddr_union addr;
  char buf [46];
  char gidbuf [64];
  
  addrlen = 0x80;
  iVar3 = getpeername(*(int *)&sock[-0x11].vt,(sockaddr *)&addr.storage,&addrlen);
  if (iVar3 < 0) {
LAB_0014481e:
    ptr = (SocketPeerInfo *)0x0;
  }
  else {
    ptr = (SocketPeerInfo *)safemalloc(1,0x30,0);
    ptr->addressfamily = 0;
    ptr->addr_text = (char *)0x0;
    ptr->port = -1;
    ptr->log_text = (char *)0x0;
    if (addr.storage.ss_family == 1) {
      ptr->addressfamily = 3;
      _Var2 = so_peercred(*(int *)&sock[-0x11].vt,&pid,&uid,&gid);
      if (!_Var2) {
        return ptr;
      }
      pcVar4 = buf;
      sprintf(pcVar4,"%d",(ulong)(uint)uid);
      pcVar7 = gidbuf;
      sprintf(pcVar7,"%d",(ulong)(uint)gid);
      ppVar5 = getpwuid(uid);
      pgVar6 = getgrgid(gid);
      if (ppVar5 != (passwd *)0x0) {
        pcVar4 = ppVar5->pw_name;
      }
      if (pgVar6 != (group *)0x0) {
        pcVar7 = pgVar6->gr_name;
      }
      pcVar4 = dupprintf("pid %d (%s:%s)",(ulong)(uint)pid,pcVar4,pcVar7);
    }
    else {
      if (addr.storage.ss_family == 10) {
        ptr->addressfamily = 2;
        *(uchar (*) [8])&ptr->addr_bin = addr.sin.sin_zero;
        *(undefined8 *)((long)&ptr->addr_bin + 8) = addr._16_8_;
        ptr->port = (uint)(ushort)(addr.sin.sin_port << 8 | addr.sin.sin_port >> 8);
        pcVar4 = inet_ntop(10,addr.storage.__ss_padding + 6,buf,0x2e);
        pcVar4 = dupstr(pcVar4);
        ptr->addr_text = pcVar4;
        uVar1 = ptr->port;
        pcVar7 = "[%s]:%d";
      }
      else {
        if (addr.storage.ss_family != 2) {
          safefree(ptr);
          goto LAB_0014481e;
        }
        ptr->addressfamily = 1;
        *(in_addr *)&ptr->addr_bin = addr.sin.sin_addr.s_addr;
        ptr->port = (uint)(ushort)(addr.sin.sin_port << 8 | addr.sin.sin_port >> 8);
        pcVar4 = inet_ntoa((in_addr)addr.sin.sin_addr.s_addr);
        pcVar4 = dupstr(pcVar4);
        ptr->addr_text = pcVar4;
        uVar1 = ptr->port;
        pcVar7 = "%s:%d";
      }
      pcVar4 = dupprintf(pcVar7,pcVar4,(ulong)uVar1);
    }
    ptr->log_text = pcVar4;
  }
  return ptr;
}

Assistant:

static SocketPeerInfo *sk_net_peer_info(Socket *sock)
{
    NetSocket *s = container_of(sock, NetSocket, sock);
    union sockaddr_union addr;
    socklen_t addrlen = sizeof(addr);
#ifndef NO_IPV6
    char buf[INET6_ADDRSTRLEN];
#endif
    SocketPeerInfo *pi;

    if (getpeername(s->s, &addr.sa, &addrlen) < 0)
        return NULL;

    pi = snew(SocketPeerInfo);
    pi->addressfamily = ADDRTYPE_UNSPEC;
    pi->addr_text = NULL;
    pi->port = -1;
    pi->log_text = NULL;

    if (addr.storage.ss_family == AF_INET) {
        pi->addressfamily = ADDRTYPE_IPV4;
        memcpy(pi->addr_bin.ipv4, &addr.sin.sin_addr, 4);
        pi->port = ntohs(addr.sin.sin_port);
        pi->addr_text = dupstr(inet_ntoa(addr.sin.sin_addr));
        pi->log_text = dupprintf("%s:%d", pi->addr_text, pi->port);

#ifndef NO_IPV6
    } else if (addr.storage.ss_family == AF_INET6) {
        pi->addressfamily = ADDRTYPE_IPV6;
        memcpy(pi->addr_bin.ipv6, &addr.sin6.sin6_addr, 16);
        pi->port = ntohs(addr.sin6.sin6_port);
        pi->addr_text = dupstr(
            inet_ntop(AF_INET6, &addr.sin6.sin6_addr, buf, sizeof(buf)));
        pi->log_text = dupprintf("[%s]:%d", pi->addr_text, pi->port);
#endif

    } else if (addr.storage.ss_family == AF_UNIX) {
        pi->addressfamily = ADDRTYPE_LOCAL;

        /*
         * For Unix sockets, the source address is unlikely to be
         * helpful, so we leave addr_txt NULL (and we certainly can't
         * fill in port, obviously). Instead, we try SO_PEERCRED and
         * try to get the source pid, and put that in the log text.
         */
        int pid, uid, gid;
        if (so_peercred(s->s, &pid, &uid, &gid)) {
            char uidbuf[64], gidbuf[64];
            sprintf(uidbuf, "%d", uid);
            sprintf(gidbuf, "%d", gid);
            struct passwd *pw = getpwuid(uid);
            struct group *gr = getgrgid(gid);
            pi->log_text = dupprintf("pid %d (%s:%s)", pid,
                                     pw ? pw->pw_name : uidbuf,
                                     gr ? gr->gr_name : gidbuf);
        }
    } else {
        sfree(pi);
        return NULL;
    }

    return pi;
}